

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TVP.cpp
# Opt level: O0

void __thiscall MT32Emu::TVP::setupPitchChange(TVP *this,int targetPitchOffset,Bit8u changeDuration)

{
  ushort uVar1;
  byte bVar2;
  int iVar3;
  int local_34;
  int durationInBigTicks;
  int currentBigTick;
  Bit16s newPitchOffsetChangePerBigTick;
  Bit16u divisor;
  uint upperDuration;
  int iStack_1c;
  Bit8u normalisationShifts;
  Bit32u absPitchOffsetDelta;
  Bit32s pitchOffsetDelta;
  bool negativeDelta;
  Bit8u changeDuration_local;
  TVP *pTStack_10;
  int targetPitchOffset_local;
  TVP *this_local;
  
  absPitchOffsetDelta._2_1_ = targetPitchOffset < this->currentPitchOffset;
  iStack_1c = targetPitchOffset - this->currentPitchOffset;
  if ((0x7fff < iStack_1c) || (iStack_1c < -0x8000)) {
    iStack_1c = 0x7fff;
  }
  if ((bool)absPitchOffsetDelta._2_1_) {
    iStack_1c = -iStack_1c;
  }
  upperDuration = iStack_1c << 0x10;
  absPitchOffsetDelta._3_1_ = changeDuration;
  pitchOffsetDelta = targetPitchOffset;
  pTStack_10 = this;
  bVar2 = normalise(&upperDuration);
  iVar3 = (int)(uint)(byte)(absPitchOffsetDelta._3_1_ - 1) >> 3;
  this->shifts = (uint)bVar2 + iVar3 + 2;
  uVar1 = *(ushort *)
           (lowerDurationToDivisor + (long)(int)((byte)(absPitchOffsetDelta._3_1_ - 1) & 7) * 2);
  durationInBigTicks._0_2_ = (short)((ulong)(upperDuration >> 1 & 0xffff0000) / (ulong)uVar1 >> 1);
  if ((absPitchOffsetDelta._2_1_ & 1) != 0) {
    durationInBigTicks._0_2_ = -(short)durationInBigTicks;
  }
  this->pitchOffsetChangePerBigTick = (short)durationInBigTicks;
  local_34 = (int)(uint)uVar1 >> (0xcU - (char)iVar3 & 0x1f);
  if (0x7fff < local_34) {
    local_34 = 0x7fff;
  }
  this->targetPitchOffsetReachedBigTick = (short)(this->timeElapsed >> 8) + (short)local_34;
  return;
}

Assistant:

void TVP::setupPitchChange(int targetPitchOffset, Bit8u changeDuration) {
	bool negativeDelta = targetPitchOffset < currentPitchOffset;
	Bit32s pitchOffsetDelta = targetPitchOffset - currentPitchOffset;
	if (pitchOffsetDelta > 32767 || pitchOffsetDelta < -32768) {
		pitchOffsetDelta = 32767;
	}
	if (negativeDelta) {
		pitchOffsetDelta = -pitchOffsetDelta;
	}
	// We want to maximise the number of bits of the Bit16s "pitchOffsetChangePerBigTick" we use in order to get the best possible precision later
	Bit32u absPitchOffsetDelta = (pitchOffsetDelta & 0xFFFF) << 16;
	Bit8u normalisationShifts = normalise(absPitchOffsetDelta); // FIXME: Double-check: normalisationShifts is usually between 0 and 15 here, unless the delta is 0, in which case it's 31
	absPitchOffsetDelta = absPitchOffsetDelta >> 1; // Make room for the sign bit

	changeDuration--; // changeDuration's now between 0 and 111
	unsigned int upperDuration = changeDuration >> 3; // upperDuration's now between 0 and 13
	shifts = normalisationShifts + upperDuration + 2;
	Bit16u divisor = lowerDurationToDivisor[changeDuration & 7];
	Bit16s newPitchOffsetChangePerBigTick = ((absPitchOffsetDelta & 0xFFFF0000) / divisor) >> 1; // Result now fits within 15 bits. FIXME: Check nothing's getting sign-extended incorrectly
	if (negativeDelta) {
		newPitchOffsetChangePerBigTick = -newPitchOffsetChangePerBigTick;
	}
	pitchOffsetChangePerBigTick = newPitchOffsetChangePerBigTick;

	int currentBigTick = timeElapsed >> 8;
	int durationInBigTicks = divisor >> (12 - upperDuration);
	if (durationInBigTicks > 32767) {
		durationInBigTicks = 32767;
	}
	// The result of the addition may exceed 16 bits, but wrapping is fine and intended here.
	targetPitchOffsetReachedBigTick = currentBigTick + durationInBigTicks;
}